

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O2

const_iterator
frozen::
unordered_map<unsigned_int,unsigned_int,2ul,frozen::elsa<unsigned_int>,std::equal_to<unsigned_int>>
::
find_impl<frozen::unordered_map<unsigned_int,unsigned_int,2ul,frozen::elsa<unsigned_int>,std::equal_to<unsigned_int>>const&,int,frozen::elsa<unsigned_int>,std::equal_to<unsigned_int>>
          (unordered_map<unsigned_int,_unsigned_int,_2UL,_frozen::elsa<unsigned_int>,_std::equal_to<unsigned_int>_>
           *self,int *key,elsa<unsigned_int> *hash,equal_to<unsigned_int> *equal)

{
  size_t sVar1;
  const_iterator this;
  
  this = (const_iterator)&self->tables_;
  sVar1 = bits::pmh_tables<4ul,frozen::elsa<unsigned_int>>::lookup<int,frozen::elsa<unsigned_int>>
                    ((pmh_tables<4ul,frozen::elsa<unsigned_int>> *)this,key,hash);
  if ((sVar1 != 2) && ((self->items_).data_[sVar1].first == *key)) {
    this = (self->items_).data_ + sVar1;
  }
  return this;
}

Assistant:

static inline constexpr auto find_impl(This&& self, KeyType const &key, Hasher const &hash, Equal const &equal) {
    auto const pos = self.tables_.lookup(key, hash);
    auto it = self.items_.begin() + pos;
    if (it != self.items_.end() && equal(it->first, key))
      return it;
    else
      return self.items_.end();
  }